

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O2

Point2f __thiscall pbrt::HaltonSampler::Get2D(HaltonSampler *this)

{
  int iVar1;
  undefined1 auVar2 [16];
  int baseIndex;
  Float FVar3;
  Tuple2<pbrt::Point2,_float> TVar4;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar5 [64];
  undefined1 extraout_var [60];
  
  iVar1 = this->dimension;
  if (iVar1 != 0) {
    baseIndex = 2;
    if (iVar1 < 999) {
      baseIndex = iVar1;
    }
    this->dimension = baseIndex + 2;
    FVar3 = ScrambledRadicalInverse
                      (baseIndex,(this->haltonPixelIndexer).sampleIndex,
                       this->digitPermutations->ptr + baseIndex);
    auVar5._0_4_ = ScrambledRadicalInverse
                             (baseIndex + 1,(this->haltonPixelIndexer).sampleIndex,
                              this->digitPermutations->ptr + (long)baseIndex + 1);
    auVar5._4_60_ = extraout_var;
    auVar2._4_4_ = extraout_XMM0_Db;
    auVar2._0_4_ = FVar3;
    auVar2._8_4_ = extraout_XMM0_Dc;
    auVar2._12_4_ = extraout_XMM0_Dd;
    auVar2 = vinsertps_avx(auVar2,auVar5._0_16_,0x10);
    return (Point2f)auVar2._0_8_;
  }
  this->dimension = 2;
  TVar4 = (Tuple2<pbrt::Point2,_float>)HaltonPixelIndexer::SampleFirst2D(&this->haltonPixelIndexer);
  return (Point2f)TVar4;
}

Assistant:

PBRT_CPU_GPU
    Point2f Get2D() {
        if (dimension == 0) {
            dimension += 2;
            return haltonPixelIndexer.SampleFirst2D();
        } else {
            if (dimension + 1 >= PrimeTableSize)
                dimension = 2;

            int dim = dimension;
            dimension += 2;
            return {ScrambledRadicalInverse(dim, haltonPixelIndexer.SampleIndex(),
                                            (*digitPermutations)[dim]),
                    ScrambledRadicalInverse(dim + 1, haltonPixelIndexer.SampleIndex(),
                                            (*digitPermutations)[dim + 1])};
        }
    }